

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

idx_t duckdb::GetNestedSortingColSize(idx_t *col_size,LogicalType *type)

{
  PhysicalType type_00;
  bool bVar1;
  idx_t iVar2;
  NotImplementedException *this;
  ulong uVar3;
  allocator local_59;
  string local_58;
  string local_38;
  
  while( true ) {
    while( true ) {
      while( true ) {
        type_00 = type->physical_type_;
        bVar1 = TypeIsConstantSize(type_00);
        if (bVar1) {
          iVar2 = GetTypeIdSize(type_00);
          *col_size = *col_size + iVar2;
          return 0;
        }
        if (type_00 != LIST) break;
        *col_size = *col_size + 2;
        type = ListType::GetChildType(type);
      }
      if (type_00 != STRUCT) break;
      *col_size = *col_size + 1;
      type = StructType::GetChildType(type,0);
    }
    if (type_00 != ARRAY) break;
    *col_size = *col_size + 1;
    type = ArrayType::GetChildType(type);
  }
  if (type_00 == VARCHAR) {
    uVar3 = (ulong)((int)*col_size - 1U & 7);
    *col_size = (*col_size - uVar3) + 0xb;
    return 0xb - uVar3;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Unable to order column with type %s",&local_59);
  LogicalType::ToString_abi_cxx11_(&local_58,type);
  NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t GetNestedSortingColSize(idx_t &col_size, const LogicalType &type) {
	auto physical_type = type.InternalType();
	if (TypeIsConstantSize(physical_type)) {
		col_size += GetTypeIdSize(physical_type);
		return 0;
	} else {
		switch (physical_type) {
		case PhysicalType::VARCHAR: {
			// Nested strings are between 4 and 11 chars long for alignment
			auto size_before_str = col_size;
			col_size += 11;
			col_size -= (col_size - 12) % 8;
			return col_size - size_before_str;
		}
		case PhysicalType::LIST:
			// Lists get 2 bytes (null and empty list)
			col_size += 2;
			return GetNestedSortingColSize(col_size, ListType::GetChildType(type));
		case PhysicalType::STRUCT:
			// Structs get 1 bytes (null)
			col_size++;
			return GetNestedSortingColSize(col_size, StructType::GetChildType(type, 0));
		case PhysicalType::ARRAY:
			// Arrays get 1 bytes (null)
			col_size++;
			return GetNestedSortingColSize(col_size, ArrayType::GetChildType(type));
		default:
			throw NotImplementedException("Unable to order column with type %s", type.ToString());
		}
	}
}